

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

void __thiscall amrex::BoxList::BoxList(BoxList *this,Box *bx,int nboxes)

{
  IndexType IVar1;
  undefined4 in_EDX;
  Box *in_RSI;
  long in_RDI;
  int in_stack_00000014;
  Box *in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_ffffffffffffffe8;
  
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0xfa93f8);
  IVar1 = Box::ixType(in_RSI);
  *(uint *)(in_RDI + 0x18) = IVar1.itype;
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::resize
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RSI,
             CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::data
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)0xfa941f);
  anon_unknown_22::chop_boxes
            ((Box *)CONCAT44(nboxes,in_stack_00000020),in_stack_00000018,in_stack_00000014);
  return;
}

Assistant:

BoxList::BoxList (const Box& bx, int nboxes)
    : btype(bx.ixType())
{
    AMREX_ASSERT(nboxes > 0);
    AMREX_ASSERT(bx.numPts() >= nboxes);

    m_lbox.resize(nboxes);
    chop_boxes(m_lbox.data(), bx, nboxes);
}